

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

int Wlc_PrsFindDefinition(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pXValue)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char extraout_DL;
  char Close;
  char cVar9;
  char Close_00;
  byte bVar10;
  int iVar11;
  char cVar12;
  int Beg;
  char *pName;
  
  vFanins->nSize = 0;
  pcVar5 = Wlc_PrsSkipSpaces(pStr);
  cVar12 = (char)pStr;
  if (*pcVar5 != '=') {
    return 0;
  }
  pcVar5 = Wlc_PrsSkipSpaces(pcVar5 + 1);
  cVar9 = *pcVar5;
  bVar10 = 1;
  if (cVar9 == '(') {
    cVar12 = '>';
    pcVar6 = Wlc_PrsFindSymbolTwo(pcVar5,'>','>');
    cVar9 = extraout_DL;
    if (pcVar6 == (char *)0x0) {
LAB_0031338c:
      pcVar6 = Wlc_PrsFindClosingParenthesis(pcVar5,cVar12,cVar9);
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = ' ';
        *pcVar5 = ' ';
        bVar10 = 1;
LAB_003133a7:
        pcVar5 = Wlc_PrsSkipSpaces(pcVar5);
        cVar9 = *pcVar5;
        goto LAB_003133b4;
      }
    }
    else {
      cVar12 = '<';
      pcVar6 = Wlc_PrsFindSymbolTwo(pcVar5,'<','<');
      cVar9 = Close;
      if (pcVar6 == (char *)0x0) goto LAB_0031338c;
      pcVar6 = Wlc_PrsFindClosingParenthesis(pcVar5,cVar12,Close);
      if (pcVar6 != (char *)0x0) {
        *pcVar5 = ' ';
        *pcVar6 = '\0';
        bVar10 = 0;
        goto LAB_003133a7;
      }
    }
LAB_0031367f:
    pcVar6 = "Expecting closing parenthesis.";
LAB_003136a0:
    iVar11 = 0;
    Wlc_PrsWriteErrorMessage(p,pcVar5,pcVar6);
  }
  else {
LAB_003133b4:
    if (0xf5 < (byte)(cVar9 - 0x3aU)) {
      pcVar5 = Wlc_PrsReadConstant(p,pcVar5,vFanins,(int *)&pName,&Beg,pXValue);
      if (pcVar5 == (char *)0x0) {
        return 0;
      }
      iVar11 = 6;
      goto LAB_0031364c;
    }
    if (cVar9 == '!') {
      iVar11 = 0x1a;
LAB_0031360e:
      pcVar5 = Wlc_PrsSkipSpaces(pcVar5 + 1);
      if (*pcVar5 == '(') {
        pcVar6 = Wlc_PrsFindClosingParenthesis(pcVar5,cVar12,Close_00);
        if (pcVar6 == (char *)0x0) goto LAB_0031367f;
        *pcVar6 = ' ';
        *pcVar5 = ' ';
      }
      pcVar5 = Wlc_PrsReadName(p,pcVar5,vFanins);
      if (pcVar5 == (char *)0x0) {
        pcVar6 = "Cannot read name after !.";
LAB_0031369b:
        pcVar5 = (char *)0x0;
        goto LAB_003136a0;
      }
    }
    else {
      if (cVar9 == '#') {
        iVar11 = 0x34;
        goto LAB_0031360e;
      }
      lVar8 = 1;
      if (cVar9 != '&') {
        if (cVar9 == '-') {
          iVar11 = 0x32;
          goto LAB_003135e9;
        }
        if (cVar9 == '@') {
          iVar11 = 0x33;
          goto LAB_0031360e;
        }
        if (cVar9 == '^') {
          iVar11 = 0x27;
          goto LAB_003135e9;
        }
        if (cVar9 != '{') {
          if (cVar9 == '|') {
            iVar11 = 0x26;
            goto LAB_003135e9;
          }
          if (cVar9 == '~') {
            cVar9 = pcVar5[1];
            lVar8 = 2;
            if (cVar9 == '&') {
              iVar11 = 0x28;
            }
            else if (cVar9 == '^') {
              iVar11 = 0x2a;
            }
            else {
              if (cVar9 != '|') {
                iVar11 = 0xf;
                goto LAB_0031360e;
              }
              iVar11 = 0x29;
            }
            goto LAB_003135e9;
          }
          pcVar5 = Wlc_PrsReadName(p,pcVar5,vFanins);
          if (pcVar5 == (char *)0x0) {
            return 0;
          }
          cVar12 = *pcVar5;
          switch(cVar12) {
          case '<':
            if (pcVar5[1] == '<') {
              if (pcVar5[2] == '<') {
                if (pcVar5[2] != '<') goto LAB_0031387f;
                pcVar6 = pcVar5 + 3;
                iVar11 = 0xc;
              }
              else {
                iVar11 = (uint)(bVar10 ^ 1) + (uint)(bVar10 ^ 1) * 2 + 0xb;
                pcVar6 = pcVar5 + 2;
              }
            }
            else {
LAB_0031387f:
              if (pcVar5[1] == '=') {
                bVar2 = true;
                bVar3 = false;
LAB_003138c6:
                if ((bVar2) && (pcVar5[1] == '=')) {
                  pcVar6 = pcVar5 + 2;
                  iVar11 = 0x23;
                }
                else if ((bVar3) && (pcVar5[1] == '=')) {
                  pcVar6 = pcVar5 + 2;
                  iVar11 = 0x24;
                }
                else {
                  switch(cVar12) {
                  case '%':
                    pcVar6 = pcVar5 + 1;
                    iVar11 = 0x2f;
                    break;
                  default:
switchD_0031390b_caseD_26:
                    Wlc_PrsWriteErrorMessage
                              (p,pcVar5,"Unsupported operation (%c).",(ulong)(uint)(int)cVar12);
                    return 0;
                  case '*':
                    iVar11 = (uint)(pcVar5[1] == '*') * 4 + 0x2d;
                    pcVar6 = pcVar5 + 2;
                    if (pcVar5[1] != '*') {
                      pcVar6 = pcVar5 + 1;
                    }
                    break;
                  case '+':
                    pcVar6 = pcVar5 + 1;
                    iVar11 = 0x2b;
                    break;
                  case '-':
                    pcVar6 = pcVar5 + 1;
                    iVar11 = 0x2c;
                    break;
                  case '/':
                    pcVar6 = pcVar5 + 1;
                    iVar11 = 0x2e;
                  }
                }
              }
              else {
                pcVar6 = pcVar5 + 1;
                iVar11 = 0x21;
              }
            }
            break;
          case '=':
            if (pcVar5[1] == '>') {
              pcVar6 = pcVar5 + 2;
              iVar11 = 0x1b;
            }
            else {
              if (pcVar5[1] != '=') {
LAB_003138ac:
                if (cVar12 == '!') goto LAB_003138b0;
LAB_003138c2:
                bVar3 = false;
LAB_003138c4:
                bVar2 = false;
                goto LAB_003138c6;
              }
              pcVar6 = pcVar5 + 2;
              iVar11 = 0x1f;
            }
            break;
          case '>':
            if (pcVar5[1] == '>') {
              if (pcVar5[2] == '>') {
                if (pcVar5[2] != '>') goto LAB_00313870;
                pcVar6 = pcVar5 + 3;
                iVar11 = 10;
              }
              else {
                iVar11 = (uint)(bVar10 ^ 1) * 4 + 9;
                pcVar6 = pcVar5 + 2;
              }
            }
            else {
LAB_00313870:
              if (pcVar5[1] == '=') {
                bVar3 = true;
                goto LAB_003138c4;
              }
              pcVar6 = pcVar5 + 1;
              iVar11 = 0x22;
            }
            break;
          case '?':
            pcVar5 = Wlc_PrsReadName(p,pcVar5 + 1,vFanins);
            if (pcVar5 != (char *)0x0) {
              if (*pcVar5 != ':') {
                pcVar6 = "MUX lacks the colon symbol (:).";
                goto LAB_003136a0;
              }
              pcVar5 = Wlc_PrsReadName(p,pcVar5 + 1,vFanins);
              if (pcVar5 != (char *)0x0) {
                if (vFanins->nSize != 3) {
                  __assert_fail("Vec_IntSize(vFanins) == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                                ,0x32a,
                                "int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)"
                               );
                }
                uVar1 = *(undefined8 *)(vFanins->pArray + 1);
                *(ulong *)(vFanins->pArray + 1) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
                iVar11 = 8;
                goto LAB_0031364c;
              }
            }
            pcVar6 = "Cannot read name in MUX.";
            goto LAB_0031369b;
          default:
            if (cVar12 != '\0') {
              if (cVar12 == '!') {
LAB_003138b0:
                if (pcVar5[1] != '=') goto LAB_003138c2;
                pcVar6 = pcVar5 + 2;
                iVar11 = 0x20;
              }
              else if (cVar12 == '&') {
                if (pcVar5[1] == '&') {
                  if (pcVar5[1] != '&') goto LAB_003138ac;
                  pcVar6 = pcVar5 + 2;
                  iVar11 = 0x1c;
                }
                else {
                  pcVar6 = pcVar5 + 1;
                  iVar11 = 0x10;
                }
              }
              else {
                if (cVar12 == '[') {
                  pcVar6 = Wlc_PrsFindRange(pcVar5,(int *)&pName,&Beg);
                  if (pcVar6 == (char *)0x0) {
                    pcVar6 = "Non-standard range.";
                    goto LAB_003136a0;
                  }
                  Vec_IntPush(vFanins,(int)pName);
                  Vec_IntPush(vFanins,Beg);
                  iVar11 = 0x16;
                  pcVar5 = pcVar6;
                  goto LAB_0031364c;
                }
                if (cVar12 == '^') {
                  iVar11 = 0x12;
                  if (pcVar5[1] == '^') {
                    iVar11 = 0x1e;
                  }
                  pcVar6 = pcVar5 + 2;
                  if (pcVar5[1] != '^') {
                    pcVar6 = pcVar5 + 1;
                  }
                }
                else if (cVar12 == '|') {
                  if (pcVar5[1] == '|') {
                    if (pcVar5[1] != '|') goto switchD_0031390b_caseD_26;
                    pcVar6 = pcVar5 + 2;
                    iVar11 = 0x1d;
                  }
                  else {
                    pcVar6 = pcVar5 + 1;
                    iVar11 = 0x11;
                  }
                }
                else {
                  if (cVar12 != '~') goto LAB_003138c2;
                  cVar9 = pcVar5[1];
                  if (cVar9 == '|') {
                    pcVar6 = pcVar5 + 2;
                    iVar11 = 0x14;
                  }
                  else if (cVar9 == '^') {
                    pcVar6 = pcVar5 + 2;
                    iVar11 = 0x15;
                  }
                  else {
                    if (cVar9 != '&') goto switchD_0031390b_caseD_26;
                    pcVar6 = pcVar5 + 2;
                    iVar11 = 0x13;
                  }
                }
              }
              break;
            }
            iVar11 = 7;
            goto LAB_0031364c;
          }
          pcVar5 = Wlc_PrsReadName(p,pcVar6 + 1,vFanins);
          if (pcVar5 == (char *)0x0) {
            return 0;
          }
          pcVar5 = Wlc_PrsSkipSpaces(pcVar5);
          if (iVar11 == 0x2b) {
            cVar12 = *pcVar5;
            if (cVar12 == '+') {
              pcVar5 = Wlc_PrsReadName(p,pcVar5 + 1,vFanins);
              if (pcVar5 == (char *)0x0) {
                return 0;
              }
              pcVar5 = Wlc_PrsSkipSpaces(pcVar5);
              goto LAB_00313a49;
            }
          }
          else {
LAB_00313a49:
            cVar12 = *pcVar5;
          }
          if (cVar12 != '\0') {
            uVar4 = Wlc_PrsFindLine(p,pcVar5);
            printf("Warning: Trailing symbols \"%s\" in line %d.\n",pcVar5,(ulong)uVar4);
          }
          goto LAB_0031364c;
        }
        pcVar6 = pcVar5 + 1;
        pcVar7 = Wlc_PrsFindSymbol(pcVar6,'{');
        if (pcVar7 != (char *)0x0) {
          pcVar5 = Wlc_PrsFindSymbol(pcVar6,'\'');
          iVar11 = (pcVar5 == (char *)0x0) + 0x18;
          pcVar5 = Wlc_PrsFindSymbol(pcVar6,',');
          if (pcVar5 == (char *)0x0) {
            pcVar6 = "Expecting one comma in this line.";
          }
          else {
            pcVar5 = Wlc_PrsReadName(p,pcVar5 + 1,vFanins);
            if (pcVar5 != (char *)0x0) {
              pcVar5 = Wlc_PrsSkipSpaces(pcVar5);
              if (*pcVar5 == '}') goto LAB_00313534;
              pcVar6 = "There is no closing brace (}).";
              goto LAB_003136a0;
            }
            pcVar6 = "Cannot read name in sign-extension.";
          }
          goto LAB_0031369b;
        }
        do {
          pcVar5 = Wlc_PrsSkipSpaces(pcVar5 + 1);
          pcVar5 = Wlc_PrsReadName(p,pcVar5,vFanins);
          if (pcVar5 == (char *)0x0) {
            pcVar6 = "Cannot read name in concatenation.";
            goto LAB_0031369b;
          }
        } while (*pcVar5 == ',');
        if (*pcVar5 == '}') {
          iVar11 = 0x17;
LAB_00313534:
          pcVar5 = pcVar5 + 1;
          goto LAB_0031364c;
        }
        pcVar6 = "Expected comma (,) in this place.";
        goto LAB_003136a0;
      }
      iVar11 = 0x25;
LAB_003135e9:
      pcVar5 = Wlc_PrsReadName(p,pcVar5 + lVar8,vFanins);
      if (pcVar5 == (char *)0x0) {
        pcVar6 = "Cannot read name after a unary operator.";
        goto LAB_0031369b;
      }
    }
LAB_0031364c:
    pcVar5 = Wlc_PrsFindName(pcVar5,&pName);
    if (pcVar5 != (char *)0x0) {
      iVar11 = 0;
      Wlc_PrsWriteErrorMessage
                (p,pcVar5,"Name %s is left at the end of the line.",CONCAT44(pName._4_4_,(int)pName)
                );
    }
  }
  return iVar11;
}

Assistant:

static inline int Wlc_PrsFindDefinition( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pXValue )
{
    char * pName;
    int Type = WLC_OBJ_NONE;
    int fRotating = 0;
    Vec_IntClear( vFanins );
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '=' )
        return 0;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( pStr[0] == '(' )
    {
        // consider rotating shifter
        if ( Wlc_PrsFindSymbolTwo(pStr, '>', '>') && Wlc_PrsFindSymbolTwo(pStr, '<', '<') )
        {
            // THIS IS A HACK TO DETECT rotating shifters
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = ' '; *pClose = 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            fRotating = 1;
        }
        else
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
            pStr = Wlc_PrsSkipSpaces( pStr );
        }
    }
    if ( Wlc_PrsIsDigit(pStr) )
    {
        int Range, Signed;
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, pXValue );
        if ( pStr == NULL )
            return 0;
        Type = WLC_OBJ_CONST;
    }
    else if ( pStr[0] == '!' || (pStr[0] == '~' && pStr[1] != '&' && pStr[1] != '|' && pStr[1] != '^') || pStr[0] == '@' || pStr[0] == '#' )
    {
        if ( pStr[0] == '!' )
            Type = WLC_OBJ_LOGIC_NOT;
        else if ( pStr[0] == '~' )
            Type = WLC_OBJ_BIT_NOT;
        else if ( pStr[0] == '@' )
            Type = WLC_OBJ_ARI_SQRT;
        else if ( pStr[0] == '#' )
            Type = WLC_OBJ_ARI_SQUARE;
        else assert( 0 );
        // skip parentheses
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( pStr[0] == '(' )
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
        }
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after !." );
    }
    else if ( pStr[0] == '-' || 
              pStr[0] == '&' || pStr[0] == '|' || pStr[0] == '^' || 
              (pStr[0] == '~' && pStr[1] == '&') || 
              (pStr[0] == '~' && pStr[1] == '|') || 
              (pStr[0] == '~' && pStr[1] == '^') )
    {
        int shift = 1;
        if ( pStr[0] == '-' )
            Type = WLC_OBJ_ARI_MINUS;
        else if ( pStr[0] == '&' )
            Type = WLC_OBJ_REDUCT_AND;
        else if ( pStr[0] == '|' )
            Type = WLC_OBJ_REDUCT_OR;
        else if ( pStr[0] == '^' )
            Type = WLC_OBJ_REDUCT_XOR;
        else if ( pStr[0] == '~' && pStr[1] == '&' )
            {Type = WLC_OBJ_REDUCT_NAND; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '|' )
            {Type = WLC_OBJ_REDUCT_NOR; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '^' )
            {Type = WLC_OBJ_REDUCT_NXOR; shift = 2;}
        else assert( 0 );
        if ( !(pStr = Wlc_PrsReadName(p, pStr+shift, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after a unary operator." );
    }
    else if ( pStr[0] == '{' )
    {
        // THIS IS A HACK TO DETECT zero padding AND sign extension
        if ( Wlc_PrsFindSymbol(pStr+1, '{') )
        {
            if ( Wlc_PrsFindSymbol(pStr+1, '\'') )
                Type = WLC_OBJ_BIT_ZEROPAD;
            else
                Type = WLC_OBJ_BIT_SIGNEXT;
            pStr = Wlc_PrsFindSymbol(pStr+1, ',');
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting one comma in this line." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in sign-extension." );
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( pStr[0] != '}' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "There is no closing brace (})." );
        }
        else // concatenation
        {
            while ( 1 )
            {
                pStr = Wlc_PrsSkipSpaces( pStr+1 );
                if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in concatenation." );
                if ( pStr[0] == '}' )
                    break;
                if ( pStr[0] != ',' )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Expected comma (,) in this place." );
            }
            Type = WLC_OBJ_BIT_CONCAT;
        }
        assert( pStr[0] == '}' );
        pStr++;
    }
    else
    {
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return 0;
        // get the next symbol
        if ( pStr[0] == 0 )
            Type = WLC_OBJ_BUF;
        else if ( pStr[0] == '?' )
        {
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            if ( pStr[0] != ':' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "MUX lacks the colon symbol (:)." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            assert( Vec_IntSize(vFanins) == 3 );
            ABC_SWAP( int, Vec_IntArray(vFanins)[1], Vec_IntArray(vFanins)[2] );
            Type = WLC_OBJ_MUX;
        }
        else if ( pStr[0] == '[' )
        {
            int End, Beg; char * pLine = pStr;
            pStr = Wlc_PrsFindRange( pStr, &End, &Beg );
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
            Vec_IntPushTwo( vFanins, End, Beg );
            Type = WLC_OBJ_BIT_SELECT;
        }
        else 
        {
                 if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] != '>' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_R : WLC_OBJ_SHIFT_R;
            else if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] == '>' ) pStr += 3, Type = WLC_OBJ_SHIFT_RA;      
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] != '<' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_L : WLC_OBJ_SHIFT_L;
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] == '<' ) pStr += 3, Type = WLC_OBJ_SHIFT_LA;      
            else if ( pStr[0] == '&' && pStr[1] != '&'                   ) pStr += 1, Type = WLC_OBJ_BIT_AND;       
            else if ( pStr[0] == '|' && pStr[1] != '|'                   ) pStr += 1, Type = WLC_OBJ_BIT_OR;        
            else if ( pStr[0] == '^' && pStr[1] != '^'                   ) pStr += 1, Type = WLC_OBJ_BIT_XOR;       
            else if ( pStr[0] == '~' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_BIT_NAND;       
            else if ( pStr[0] == '~' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_BIT_NOR;       
            else if ( pStr[0] == '~' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_BIT_NXOR;       
            else if ( pStr[0] == '=' && pStr[1] == '>'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_IMPL;     
            else if ( pStr[0] == '&' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_AND;     
            else if ( pStr[0] == '|' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_OR;      
            else if ( pStr[0] == '^' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_XOR;      
            else if ( pStr[0] == '=' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_EQU;      
            else if ( pStr[0] == '!' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_NOTEQU;      
            else if ( pStr[0] == '<' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_LESS;     
            else if ( pStr[0] == '>' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_MORE;     
            else if ( pStr[0] == '<' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_LESSEQU;
            else if ( pStr[0] == '>' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_MOREEQU;  
            else if ( pStr[0] == '+'                                     ) pStr += 1, Type = WLC_OBJ_ARI_ADD;       
            else if ( pStr[0] == '-'                                     ) pStr += 1, Type = WLC_OBJ_ARI_SUB;       
            else if ( pStr[0] == '*' && pStr[1] != '*'                   ) pStr += 1, Type = WLC_OBJ_ARI_MULTI;     
            else if ( pStr[0] == '/'                                     ) pStr += 1, Type = WLC_OBJ_ARI_DIVIDE;        
            else if ( pStr[0] == '%'                                     ) pStr += 1, Type = WLC_OBJ_ARI_REM;   
            else if ( pStr[0] == '*' && pStr[1] == '*'                   ) pStr += 2, Type = WLC_OBJ_ARI_POWER;
            else return Wlc_PrsWriteErrorMessage( p, pStr, "Unsupported operation (%c).", pStr[0] );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( Type == WLC_OBJ_ARI_ADD && pStr[0] == '+' )
            {
                if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                    return 0;
                pStr = Wlc_PrsSkipSpaces( pStr );
            }
            if ( pStr[0] )
                printf( "Warning: Trailing symbols \"%s\" in line %d.\n", pStr, Wlc_PrsFindLine(p, pStr) );
        }
    }
    // make sure there is nothing left there
    if ( pStr )
    {
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr != NULL )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is left at the end of the line.", pName );   
    }
    return Type;
}